

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::PrintableNameForExtension_abi_cxx11_(FieldDescriptor *this)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  FieldDescriptor *in_RDI;
  bool bVar4;
  bool is_message_set_extension;
  undefined8 local_28;
  Descriptor *in_stack_ffffffffffffffe0;
  uint6 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  bVar1 = is_extension(in_RDI);
  bVar4 = false;
  if (bVar1) {
    pDVar3 = containing_type(in_RDI);
    Descriptor::options(pDVar3);
    bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x4d79e4);
    bVar4 = false;
    if (bVar1) {
      TVar2 = type((FieldDescriptor *)
                   CONCAT17(in_stack_fffffffffffffff7,(uint7)in_stack_fffffffffffffff0));
      bVar4 = false;
      if (TVar2 == TYPE_MESSAGE) {
        bVar1 = is_optional((FieldDescriptor *)0x4d7a14);
        bVar4 = false;
        if (bVar1) {
          in_stack_ffffffffffffffe0 = extension_scope(in_RDI);
          pDVar3 = message_type((FieldDescriptor *)in_stack_ffffffffffffffe0);
          bVar4 = in_stack_ffffffffffffffe0 == pDVar3;
        }
      }
    }
  }
  if (bVar4) {
    pDVar3 = message_type((FieldDescriptor *)in_stack_ffffffffffffffe0);
    local_28 = Descriptor::full_name_abi_cxx11_(pDVar3);
  }
  else {
    local_28 = full_name_abi_cxx11_(in_RDI);
  }
  return local_28;
}

Assistant:

const std::string& FieldDescriptor::PrintableNameForExtension() const {
  const bool is_message_set_extension =
      is_extension() &&
      containing_type()->options().message_set_wire_format() &&
      type() == FieldDescriptor::TYPE_MESSAGE && is_optional() &&
      extension_scope() == message_type();
  return is_message_set_extension ? message_type()->full_name() : full_name();
}